

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Cpcc cpcc)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  
  switch(cpcc.raw) {
  case 0:
    cVar2 = 'f';
    goto LAB_0012fc8d;
  case 1:
    cVar2 = 'e';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbeq"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 2:
    cVar2 = 'o';
    lVar3 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbogt"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 3:
    cVar2 = 'o';
    lVar3 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdboge"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 4:
    cVar2 = 'o';
    lVar3 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbolt"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 5:
    cVar2 = 'o';
    lVar3 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbole"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 6:
    cVar2 = 'o';
    lVar3 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbogl"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 7:
    cVar2 = 'o';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbor"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 8:
    cVar2 = 'u';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbun"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 9:
    cVar2 = 'u';
    lVar3 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbueq"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 10:
    cVar2 = 'u';
    lVar3 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbugt"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 0xb:
    cVar2 = 'u';
    lVar3 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbuge"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 0xc:
    cVar2 = 'u';
    lVar3 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbult"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 0xd:
    cVar2 = 'u';
    lVar3 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbule"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 0xe:
    cVar2 = 'n';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbne"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 0xf:
    cVar2 = 't';
    goto LAB_0012fc8d;
  case 0x10:
    cVar2 = 's';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbsf"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 0x11:
    cVar2 = 's';
    lVar3 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbseq"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 0x12:
    cVar2 = 'g';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbgt"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 0x13:
    cVar2 = 'g';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbge"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 0x14:
    cVar2 = 'l';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "halt"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 0x15:
    cVar2 = 'l';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "%le"[lVar3 + 2];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 0x16:
    cVar2 = 'g';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbgl"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 0x17:
    cVar2 = 'g';
    lVar3 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbgle"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 0x18:
    cVar2 = 'n';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbngle"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 0x19:
    cVar2 = 'n';
    lVar3 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbngl"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 0x1a:
    cVar2 = 'n';
    lVar3 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbnle"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 0x1b:
    cVar2 = 'n';
    lVar3 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbnlt"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 0x1c:
    cVar2 = 'n';
    lVar3 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbnge"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 0x1d:
    cVar2 = 'n';
    lVar3 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbngt"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 0x1e:
    cVar2 = 's';
    lVar3 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdbsne"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case 0x1f:
    cVar2 = 's';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "cp0st"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  default:
    cVar2 = '?';
LAB_0012fc8d:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = cVar2;
    return this;
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Cpcc cpcc)
{
    switch (cpcc.raw) {

        case 0:  *this << "f";      break;
        case 1:  *this << "eq";     break;
        case 2:  *this << "ogt";    break;
        case 3:  *this << "oge";    break;
        case 4:  *this << "olt";    break;
        case 5:  *this << "ole";    break;
        case 6:  *this << "ogl";    break;
        case 7:  *this << "or";     break;
        case 8:  *this << "un";     break;
        case 9:  *this << "ueq";    break;
        case 10: *this << "ugt";    break;
        case 11: *this << "uge";    break;
        case 12: *this << "ult";    break;
        case 13: *this << "ule";    break;
        case 14: *this << "ne";     break;
        case 15: *this << "t";      break;
        case 16: *this << "sf";     break;
        case 17: *this << "seq";    break;
        case 18: *this << "gt";     break;
        case 19: *this << "ge";     break;
        case 20: *this << "lt";     break;
        case 21: *this << "le";     break;
        case 22: *this << "gl";     break;
        case 23: *this << "gle";    break;
        case 24: *this << "ngle";   break;
        case 25: *this << "ngl";    break;
        case 26: *this << "nle";    break;
        case 27: *this << "nlt";    break;
        case 28: *this << "nge";    break;
        case 29: *this << "ngt";    break;
        case 30: *this << "sne";    break;
        case 31: *this << "st";     break;

        default:
            *this << "?";
    }
    return *this;
}